

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawSpanP_C(void)

{
  byte bVar1;
  byte bVar2;
  lighttable_t *plVar3;
  dsfixed_t dVar4;
  dsfixed_t dVar5;
  BYTE *pBVar6;
  byte bVar7;
  int xmask;
  BYTE xshift;
  int iStack_34;
  BYTE yshift;
  int spot;
  int count;
  BYTE *colormap;
  BYTE *source;
  BYTE *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  
  pBVar6 = ds_source;
  dVar5 = ds_ystep;
  dVar4 = ds_xstep;
  plVar3 = ds_colormap;
  xstep = ds_xfrac;
  ystep = ds_yfrac;
  source = dc_destorg + (ylookup[ds_y] + ds_x1);
  iStack_34 = (ds_x2 - ds_x1) + 1;
  if ((ds_xbits == 6) && (ds_ybits == 6)) {
    do {
      *source = plVar3[pBVar6[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))]];
      xstep = dVar4 + xstep;
      ystep = dVar5 + ystep;
      iStack_34 = iStack_34 + -1;
      source = source + 1;
    } while (iStack_34 != 0);
  }
  else {
    bVar1 = (byte)ds_ybits;
    bVar7 = 0x20 - bVar1;
    bVar2 = (byte)ds_xbits;
    do {
      *source = plVar3[pBVar6[(int)((xstep >> (bVar7 - bVar2 & 0x1f) &
                                    (1 << (bVar2 & 0x1f)) + -1 << (bVar1 & 0x1f)) +
                                   (ystep >> (bVar7 & 0x1f)))]];
      xstep = dVar4 + xstep;
      ystep = dVar5 + ystep;
      iStack_34 = iStack_34 + -1;
      source = source + 1;
    } while (iStack_34 != 0);
  }
  return;
}

Assistant:

void R_DrawSpanP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;

#ifdef RANGECHECK 
	if (ds_x2 < ds_x1 || ds_x1 < 0
		|| ds_x2 >= screen->width || ds_y > screen->height)
	{
		I_Error ("R_DrawSpan: %i to %i at %i", ds_x1, ds_x2, ds_y);
	}
//		dscount++;
#endif

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			// Current texture index in u,v.
			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));

			// Lookup pixel from flat texture tile,
			//  re-index using light/colormap.
			*dest++ = colormap[source[spot]];

			// Next step in u,v.
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;

		do
		{
			// Current texture index in u,v.
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);

			// Lookup pixel from flat texture tile,
			//  re-index using light/colormap.
			*dest++ = colormap[source[spot]];

			// Next step in u,v.
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}